

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemastypes.c
# Opt level: O0

int xmlSchemaComparePreserveReplaceStrings(xmlChar *x,xmlChar *y,int invert)

{
  bool bVar1;
  int tmp;
  int invert_local;
  xmlChar *y_local;
  xmlChar *x_local;
  
  _tmp = y;
  y_local = x;
  do {
    bVar1 = false;
    if (*y_local != '\0') {
      bVar1 = *_tmp != 0;
    }
    if (!bVar1) {
      if (*y_local != '\0') {
        if (invert != 0) {
          return -1;
        }
        return 1;
      }
      if (*_tmp == 0) {
        return 0;
      }
      if (invert != 0) {
        return 1;
      }
      return -1;
    }
    if (((*_tmp == 9) || (*_tmp == 10)) || (*_tmp == 0xd)) {
      if (*y_local != ' ') {
        if (-1 < (int)(*y_local - 0x20)) {
          if (invert != 0) {
            return -1;
          }
          return 1;
        }
        if (invert != 0) {
          return 1;
        }
        return -1;
      }
    }
    else {
      if ((int)((uint)*y_local - (uint)*_tmp) < 0) {
        if (invert != 0) {
          return 1;
        }
        return -1;
      }
      if (0 < (int)((uint)*y_local - (uint)*_tmp)) {
        if (invert == 0) {
          x_local._4_4_ = 1;
        }
        else {
          x_local._4_4_ = -1;
        }
        return x_local._4_4_;
      }
    }
    y_local = y_local + 1;
    _tmp = _tmp + 1;
  } while( true );
}

Assistant:

static int
xmlSchemaComparePreserveReplaceStrings(const xmlChar *x,
				       const xmlChar *y,
				       int invert)
{
    int tmp;

    while ((*x != 0) && (*y != 0)) {
	if (IS_WSP_REPLACE_CH(*y)) {
	    if (! IS_WSP_SPACE_CH(*x)) {
		if ((*x - 0x20) < 0) {
		    if (invert)
			return(1);
		    else
			return(-1);
		} else {
		    if (invert)
			return(-1);
		    else
			return(1);
		}
	    }
	} else {
	    tmp = *x - *y;
	    if (tmp < 0) {
		if (invert)
		    return(1);
		else
		    return(-1);
	    }
	    if (tmp > 0) {
		if (invert)
		    return(-1);
		else
		    return(1);
	    }
	}
	x++;
	y++;
    }
    if (*x != 0) {
	if (invert)
	    return(-1);
	else
	    return(1);
    }
    if (*y != 0) {
	if (invert)
	    return(1);
	else
	    return(-1);
    }
    return(0);
}